

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O1

void __thiscall SQFunctionProto::Finalize(SQFunctionProto *this)

{
  long *plVar1;
  uint uVar2;
  SQObjectPtr *pSVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  
  if (0 < this->_nliterals) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pSVar3 = this->_literals;
      plVar4 = *(long **)((long)&(pSVar3->super_SQObject)._type + lVar5);
      uVar2 = *(uint *)((long)pSVar3 + lVar5 + -8);
      *(undefined4 *)((long)pSVar3 + lVar5 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar3->super_SQObject)._type + lVar5) = 0;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = plVar4 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar4 + 0x10))();
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->_nliterals);
  }
  return;
}

Assistant:

void Finalize(){ _NULL_SQOBJECT_VECTOR(_literals,_nliterals); }